

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::DataFlowOpts::create(DataFlowOpts *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x390);
  memset(__s,0,0x390);
  __s[2] = (_func_int *)(__s + 4);
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  __s[0x21] = (_func_int *)0x0;
  __s[0x22] = (_func_int *)0x0;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)0x0;
  __s[0x25] = (_func_int *)0x0;
  *__s = (_func_int *)&PTR__DataFlowOpts_01071e70;
  __s[0x26] = (_func_int *)(__s + 0x2c);
  __s[0x27] = (_func_int *)0x1;
  __s[0x28] = (_func_int *)0x0;
  __s[0x29] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x2a) = 0x3f800000;
  __s[0x2b] = (_func_int *)0x0;
  __s[0x2c] = (_func_int *)0x0;
  __s[0x2d] = (_func_int *)(__s + 0x33);
  __s[0x2e] = (_func_int *)0x1;
  __s[0x2f] = (_func_int *)0x0;
  __s[0x30] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x31) = 0x3f800000;
  __s[0x32] = (_func_int *)0x0;
  __s[0x33] = (_func_int *)0x0;
  DataFlow::Graph::Graph((Graph *)(__s + 0x34));
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>)
  .super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<DataFlowOpts>();
  }